

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

char * Pa_GetErrorText(PaError errorCode)

{
  char *local_18;
  char *result;
  PaError errorCode_local;
  
  if (errorCode == -10000) {
    local_18 = "PortAudio not initialized";
  }
  else if (errorCode == -9999) {
    local_18 = "Unanticipated host error";
  }
  else if (errorCode == -0x270e) {
    local_18 = "Invalid number of channels";
  }
  else if (errorCode == -0x270d) {
    local_18 = "Invalid sample rate";
  }
  else if (errorCode == -0x270c) {
    local_18 = "Invalid device";
  }
  else if (errorCode == -0x270b) {
    local_18 = "Invalid flag";
  }
  else if (errorCode == -0x270a) {
    local_18 = "Sample format not supported";
  }
  else if (errorCode == -0x2709) {
    local_18 = "Illegal combination of I/O devices";
  }
  else if (errorCode == -0x2708) {
    local_18 = "Insufficient memory";
  }
  else if (errorCode == -0x2707) {
    local_18 = "Buffer too big";
  }
  else if (errorCode == -0x2706) {
    local_18 = "Buffer too small";
  }
  else if (errorCode == -0x2705) {
    local_18 = "No callback routine specified";
  }
  else if (errorCode == -0x2704) {
    local_18 = "Invalid stream pointer";
  }
  else if (errorCode == -0x2703) {
    local_18 = "Wait timed out";
  }
  else if (errorCode == -0x2702) {
    local_18 = "Internal PortAudio error";
  }
  else if (errorCode == -0x2701) {
    local_18 = "Device unavailable";
  }
  else if (errorCode == -0x2700) {
    local_18 = "Incompatible host API specific stream info";
  }
  else if (errorCode == -0x26ff) {
    local_18 = "Stream is stopped";
  }
  else if (errorCode == -0x26fe) {
    local_18 = "Stream is not stopped";
  }
  else if (errorCode == -0x26fd) {
    local_18 = "Input overflowed";
  }
  else if (errorCode == -0x26fc) {
    local_18 = "Output underflowed";
  }
  else if (errorCode == -0x26fb) {
    local_18 = "Host API not found";
  }
  else if (errorCode == -0x26fa) {
    local_18 = "Invalid host API";
  }
  else if (errorCode == -0x26f9) {
    local_18 = "Can\'t read from a callback stream";
  }
  else if (errorCode == -0x26f8) {
    local_18 = "Can\'t write to a callback stream";
  }
  else if (errorCode == -0x26f7) {
    local_18 = "Can\'t read from an output only stream";
  }
  else if (errorCode == -0x26f6) {
    local_18 = "Can\'t write to an input only stream";
  }
  else if (errorCode == -0x26f5) {
    local_18 = "Incompatible stream host API";
  }
  else if (errorCode == -0x26f4) {
    local_18 = "Bad buffer pointer";
  }
  else if (errorCode == 0) {
    local_18 = "Success";
  }
  else if (errorCode < 1) {
    local_18 = "Invalid error code";
  }
  else {
    local_18 = "Invalid error code (value greater than zero)";
  }
  return local_18;
}

Assistant:

const char *Pa_GetErrorText( PaError errorCode )
{
    const char *result;

    switch( errorCode )
    {
    case paNoError:                  result = "Success"; break;
    case paNotInitialized:           result = "PortAudio not initialized"; break;
    /** @todo could catenate the last host error text to result in the case of paUnanticipatedHostError. see: http://www.portaudio.com/trac/ticket/114 */
    case paUnanticipatedHostError:   result = "Unanticipated host error"; break;
    case paInvalidChannelCount:      result = "Invalid number of channels"; break;
    case paInvalidSampleRate:        result = "Invalid sample rate"; break;
    case paInvalidDevice:            result = "Invalid device"; break;
    case paInvalidFlag:              result = "Invalid flag"; break;
    case paSampleFormatNotSupported: result = "Sample format not supported"; break;
    case paBadIODeviceCombination:   result = "Illegal combination of I/O devices"; break;
    case paInsufficientMemory:       result = "Insufficient memory"; break;
    case paBufferTooBig:             result = "Buffer too big"; break;
    case paBufferTooSmall:           result = "Buffer too small"; break;
    case paNullCallback:             result = "No callback routine specified"; break;
    case paBadStreamPtr:             result = "Invalid stream pointer"; break;
    case paTimedOut:                 result = "Wait timed out"; break;
    case paInternalError:            result = "Internal PortAudio error"; break;
    case paDeviceUnavailable:        result = "Device unavailable"; break;
    case paIncompatibleHostApiSpecificStreamInfo:   result = "Incompatible host API specific stream info"; break;
    case paStreamIsStopped:          result = "Stream is stopped"; break;
    case paStreamIsNotStopped:       result = "Stream is not stopped"; break;
    case paInputOverflowed:          result = "Input overflowed"; break;
    case paOutputUnderflowed:        result = "Output underflowed"; break;
    case paHostApiNotFound:          result = "Host API not found"; break;
    case paInvalidHostApi:           result = "Invalid host API"; break;
    case paCanNotReadFromACallbackStream:       result = "Can't read from a callback stream"; break;
    case paCanNotWriteToACallbackStream:        result = "Can't write to a callback stream"; break;
    case paCanNotReadFromAnOutputOnlyStream:    result = "Can't read from an output only stream"; break;
    case paCanNotWriteToAnInputOnlyStream:      result = "Can't write to an input only stream"; break;
    case paIncompatibleStreamHostApi: result = "Incompatible stream host API"; break;
    case paBadBufferPtr:             result = "Bad buffer pointer"; break;
    default:                         
		if( errorCode > 0 )
			result = "Invalid error code (value greater than zero)"; 
        else
			result = "Invalid error code"; 
        break;
    }
    return result;
}